

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
boost::exception_detail::
clone_impl<boost::exception_detail::error_info_injector<boost::thread_resource_error>_>::clone_impl
          (void *param_1,exception *param_2)

{
  error_info_injector<boost::thread_resource_error> *in_stack_ffffffffffffffc8;
  exception *a;
  
  a = (exception *)param_1;
  clone_base::clone_base((clone_base *)((long)param_1 + 0x68));
  error_info_injector<boost::thread_resource_error>::error_info_injector
            ((error_info_injector<boost::thread_resource_error> *)param_1,in_stack_ffffffffffffffc8)
  ;
  *(undefined8 *)
   &(((error_info_injector<boost::thread_resource_error> *)param_1)->super_thread_resource_error).
    super_thread_exception.super_system_error = 0x305280;
  (((error_info_injector<boost::thread_resource_error> *)param_1)->super_exception)._vptr_exception
       = (_func_int **)0x3052b8;
  *(undefined8 *)
   &(((error_info_injector<boost::thread_resource_error> *)((long)param_1 + 0x68))->
    super_thread_resource_error).super_thread_exception.super_system_error = 0x3052f0;
  copy_boost_exception(a,param_2);
  return;
}

Assistant:

clone_impl( clone_impl const & x, clone_tag ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }